

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ExpressionResultBuilder * __thiscall
Catch::ExpressionLhs<std::_Rb_tree_const_iterator<int>const&>::
captureExpression<(Catch::Internal::Operator)1,std::_Rb_tree_const_iterator<int>>
          (ExpressionLhs<std::_Rb_tree_const_iterator<int>const&> *this,
          _Rb_tree_const_iterator<int> *rhs)

{
  undefined4 uVar1;
  _Rb_tree_const_iterator<int> *in_RDX;
  _Rb_tree_const_iterator<int> *extraout_RDX;
  allocator local_79;
  string local_78 [32];
  string local_58;
  string local_38;
  
  uVar1 = 0x11;
  if (*(_Base_ptr *)*(StringMakerBase<false> **)(this + 0x228) != rhs->_M_node) {
    uVar1 = 0;
  }
  *(undefined4 *)(this + 0x40) = uVar1;
  Detail::StringMakerBase<false>::convert<std::_Rb_tree_const_iterator<int>>
            (&local_38,*(StringMakerBase<false> **)(this + 0x228),in_RDX);
  std::__cxx11::string::_M_assign((string *)(this + 0x50));
  Detail::StringMakerBase<false>::convert<std::_Rb_tree_const_iterator<int>>
            (&local_58,(StringMakerBase<false> *)rhs,extraout_RDX);
  std::__cxx11::string::_M_assign((string *)(this + 0x70));
  std::__cxx11::string::string(local_78,"!=",&local_79);
  std::__cxx11::string::_M_assign((string *)(this + 0x90));
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return (ExpressionResultBuilder *)this;
}

Assistant:

ExpressionResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_result
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }